

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O0

int slu_mmdupd_(int_t *ehead,int *neqns,int_t *xadj,shortint *adjncy,int_t *delta,int_t *mdeg,
               shortint *dhead,int *dforw,int *dbakw,shortint *qsize,shortint *llist,
               shortint *marker,int_t *maxint,int_t *tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int local_8c;
  int local_88;
  int_t deg0;
  int_t deg;
  int_t iq2;
  int_t qxhead;
  int_t jstrt;
  int_t istrt;
  int_t q2head;
  int_t jstop;
  int_t istop;
  int_t elmnt;
  int_t nabor;
  int_t fnode;
  int_t enode;
  int_t j;
  int_t i;
  int_t mdeg0;
  int_t link;
  int_t mtag;
  int_t node;
  int_t i__2;
  int_t i__1;
  int_t *mdeg_local;
  int_t *delta_local;
  shortint *adjncy_local;
  int_t *xadj_local;
  int *neqns_local;
  int_t *ehead_local;
  
  iVar1 = *mdeg;
  iVar2 = *delta;
  jstop = *ehead;
LAB_0010fd05:
  if (jstop < 1) {
    return 0;
  }
  mdeg0 = *tag + iVar1 + iVar2;
  if (*maxint <= mdeg0) {
    *tag = 1;
    iVar3 = *neqns;
    for (enode = 1; enode <= iVar3; enode = enode + 1) {
      if (marker[(long)enode + -1] < *maxint) {
        marker[(long)enode + -1] = 0;
      }
    }
    mdeg0 = *tag + iVar1 + iVar2;
  }
  jstrt = 0;
  deg = 0;
  local_8c = 0;
  i = jstop;
LAB_0010fda7:
  enode = xadj[(long)i + -1];
  iVar3 = xadj[(long)(i + 1) + -1];
  do {
    if (iVar3 + -1 < enode) {
LAB_0010fe9f:
      nabor = jstrt;
      bVar5 = true;
LAB_0010feac:
      if (nabor < 1) {
        nabor = deg;
        bVar5 = false;
        goto LAB_001100ca;
      }
      if (dbakw[(long)nabor + -1] != 0) goto LAB_001102d6;
      *tag = *tag + 1;
      local_88 = local_8c;
      istop = adjncy[(long)xadj[(long)nabor + -1] + -1];
      if (istop == jstop) {
        istop = adjncy[(long)(xadj[(long)nabor + -1] + 1) + -1];
      }
      i = istop;
      if (dforw[(long)istop + -1] < 0) {
LAB_0010ff41:
        enode = xadj[(long)i + -1];
        iVar3 = xadj[(long)(i + 1) + -1];
        do {
          if (iVar3 + -1 < enode) goto LAB_0011025e;
          iVar6 = adjncy[(long)enode + -1];
          i = -iVar6;
          if (iVar6 != nabor) {
            if (iVar6 < 0) goto LAB_0010ff41;
            if (iVar6 == 0) goto LAB_0011025e;
            if (qsize[(long)iVar6 + -1] != 0) {
              if (marker[(long)iVar6 + -1] < *tag) {
                marker[(long)iVar6 + -1] = *tag;
                local_88 = qsize[(long)iVar6 + -1] + local_88;
              }
              else if (dbakw[(long)iVar6 + -1] == 0) {
                if (dforw[(long)iVar6 + -1] == 2) {
                  qsize[(long)nabor + -1] = qsize[(long)iVar6 + -1] + qsize[(long)nabor + -1];
                  qsize[(long)iVar6 + -1] = 0;
                  marker[(long)iVar6 + -1] = *maxint;
                  dforw[(long)iVar6 + -1] = -nabor;
                  dbakw[(long)iVar6 + -1] = -*maxint;
                }
                else if (dbakw[(long)iVar6 + -1] == 0) {
                  dbakw[(long)iVar6 + -1] = -*maxint;
                }
              }
            }
          }
          enode = enode + 1;
        } while( true );
      }
      local_88 = qsize[(long)istop + -1] + local_8c;
LAB_0011025e:
      do {
        iVar6 = (local_88 - qsize[(long)nabor + -1]) + 1;
        iVar3 = dhead[(long)iVar6 + -1];
        dforw[(long)nabor + -1] = iVar3;
        dbakw[(long)nabor + -1] = -iVar6;
        if (0 < iVar3) {
          dbakw[(long)iVar3 + -1] = nabor;
        }
        dhead[(long)iVar6 + -1] = nabor;
        if (iVar6 < *mdeg) {
          *mdeg = iVar6;
        }
LAB_001102d6:
        do {
          nabor = llist[(long)nabor + -1];
          if (bVar5) goto LAB_0010feac;
LAB_001100ca:
          if (nabor < 1) {
            *tag = mdeg0;
            jstop = llist[(long)jstop + -1];
            goto LAB_0010fd05;
          }
        } while (dbakw[(long)nabor + -1] != 0);
        *tag = *tag + 1;
        local_88 = local_8c;
        enode = xadj[(long)nabor + -1];
        iVar3 = xadj[(long)(nabor + 1) + -1];
        while ((enode <= iVar3 + -1 && (i = adjncy[(long)enode + -1], i != 0))) {
          if (marker[(long)i + -1] < *tag) {
            marker[(long)i + -1] = *tag;
            if (dforw[(long)i + -1] < 0) {
              do {
                fnode = xadj[(long)i + -1];
                iVar6 = xadj[(long)(i + 1) + -1];
                while( true ) {
                  if (iVar6 + -1 < fnode) goto LAB_0011024c;
                  iVar4 = adjncy[(long)fnode + -1];
                  i = -iVar4;
                  if (iVar4 < 0) break;
                  if (iVar4 == 0) goto LAB_0011024c;
                  if (marker[(long)iVar4 + -1] < *tag) {
                    marker[(long)iVar4 + -1] = *tag;
                    local_88 = qsize[(long)iVar4 + -1] + local_88;
                  }
                  fnode = fnode + 1;
                }
              } while( true );
            }
            local_88 = qsize[(long)i + -1] + local_88;
          }
LAB_0011024c:
          enode = enode + 1;
        }
      } while( true );
    }
    iVar6 = adjncy[(long)enode + -1];
    i = -iVar6;
    if (iVar6 < 0) goto LAB_0010fda7;
    if (iVar6 == 0) goto LAB_0010fe9f;
    if (qsize[(long)iVar6 + -1] != 0) {
      local_8c = qsize[(long)iVar6 + -1] + local_8c;
      marker[(long)iVar6 + -1] = mdeg0;
      if (dbakw[(long)iVar6 + -1] == 0) {
        if (dforw[(long)iVar6 + -1] == 2) {
          llist[(long)iVar6 + -1] = jstrt;
          jstrt = iVar6;
        }
        else {
          llist[(long)iVar6 + -1] = deg;
          deg = iVar6;
        }
      }
    }
    enode = enode + 1;
  } while( true );
}

Assistant:

int slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag)
{
    /* System generated locals */
    int_t i__1, i__2;

    /* Local variables */
    int_t node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt, 
	    istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
	return 0;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
	goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	enode = adjncy[i];
	link = -enode;
	if (enode < 0) {
	    goto L400;
	} else if (enode == 0) {
	    goto L800;
	} else {
	    goto L500;
	}

L500:
	if (qsize[enode] == 0) {
	    goto L700;
	}
	deg0 += qsize[enode];
	marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
	if (dbakw[enode] != 0) {
	    goto L700;
	}
/*                            --------------------------------------- 
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS. 
*/
/*                            --------------------------------------- 
*/
	if (dforw[enode] == 2) {
	    goto L600;
	}
	llist[enode] = qxhead;
	qxhead = enode;
	goto L700;
L600:
	llist[enode] = q2head;
	q2head = enode;
L700:
	;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
	goto L1500;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
	nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
	goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	node = adjncy[i];
	link = -node;
	if (node == enode) {
	    goto L1400;
	}
	if (node < 0) {
	    goto L1000;
	} else if (node == 0) {
	    goto L2100;
	} else {
	    goto L1100;
	}

L1100:
	if (qsize[node] == 0) {
	    goto L1400;
	}
	if (marker[node] >= *tag) {
	    goto L1200;
	}
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
	marker[node] = *tag;
	deg += qsize[node];
	goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
	if (dbakw[node] != 0) {
	    goto L1400;
	}
	if (dforw[node] != 2) {
	    goto L1300;
	}
	qsize[enode] += qsize[node];
	qsize[node] = 0;
	marker[node] = *maxint;
	dforw[node] = -enode;
	dbakw[node] = -(*maxint);
	goto L1400;
L1300:
/*                            -------------------------------------- 
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE. 
*/
/*                            -------------------------------------- 
*/
	if (dbakw[node] == 0) {
	    dbakw[node] = -(*maxint);
	}
L1400:
	;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
	goto L2300;
    }
    if (dbakw[enode] != 0) {
	goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
	nabor = adjncy[i];
	if (nabor == 0) {
	    goto L2100;
	}
	if (marker[nabor] >= *tag) {
	    goto L2000;
	}
	marker[nabor] = *tag;
	link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
	if (dforw[nabor] < 0) {
	    goto L1700;
	}
	deg += qsize[nabor];
	goto L2000;
L1700:
/*                                    ------------------------------- 
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED 
*/
/*                                    NODES IN THIS ELEMENT INTO THE 
*/
/*                                    DEGREE COUNT. */
/*                                    ------------------------------- 
*/
	jstrt = xadj[link];
	jstop = xadj[link + 1] - 1;
	i__2 = jstop;
	for (j = jstrt; j <= i__2; ++j) {
	    node = adjncy[j];
	    link = -node;
	    if (node < 0) {
		goto L1700;
	    } else if (node == 0) {
		goto L2000;
	    } else {
		goto L1800;
	    }

L1800:
	    if (marker[node] >= *tag) {
		goto L1900;
	    }
	    marker[node] = *tag;
	    deg += qsize[node];
L1900:
	    ;
	}
L2000:
	;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
	dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
	*mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
	goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}